

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# empty.c
# Opt level: O0

int thread_main(void *data)

{
  undefined1 local_20 [8];
  timespec time;
  void *data_local;
  
  time.tv_nsec = (__syscall_slong_t)data;
  while (running != 0) {
    clock_gettime(0,(timespec *)local_20);
    local_20 = (undefined1  [8])((long)local_20 + 1);
    thrd_sleep((timespec *)local_20,(timespec *)0x0);
    glfwPostEmptyEvent();
  }
  return 0;
}

Assistant:

static int thread_main(void* data)
{
    struct timespec time;

    while (running)
    {
        clock_gettime(CLOCK_REALTIME, &time);
        time.tv_sec += 1;
        thrd_sleep(&time, NULL);

        glfwPostEmptyEvent();
    }

    return 0;
}